

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy_allocator.h
# Opt level: O0

int cppcms::impl::buddy_allocator::containts_bits(size_t n)

{
  ulong uVar1;
  size_t lower;
  size_t upper;
  int i;
  size_t n_local;
  
  i = 0x3e;
  while( true ) {
    if (i < 1) {
      return -1;
    }
    uVar1 = 1L << ((char)i + 1U & 0x3f);
    if ((uVar1 >> 1 <= n) && (n < uVar1)) break;
    i = i + -1;
  }
  return i;
}

Assistant:

static int containts_bits(size_t n)
	{
		for(int i=sizeof(n)*8-2;i>0;i--)  {
			size_t upper = size_t(1) << (i + 1);
			size_t lower = upper / 2;
			if(lower <= n && n< upper)
				return i;
		}
		return -1;
		
	}